

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_DropContainer_canDetermineSpecificationForDropContainer_Test::TestBody
          (QueryTests_DropContainer_canDetermineSpecificationForDropContainer_Test *this)

{
  bool bVar1;
  TransactionMetaType TVar2;
  char *pcVar3;
  char *in_R9;
  string local_250;
  AssertHelper local_230;
  Message local_228;
  string local_220;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1c8;
  Message local_1c0;
  string local_1b8;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__1;
  string local_178;
  AssertHelper local_158;
  Message local_150 [3];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  Query query_drop_container;
  QueryTests_DropContainer_canDetermineSpecificationForDropContainer_Test *this_local;
  
  database::Query::Query((Query *)&gtest_ar_.message_,"drop container company.employee");
  TVar2 = database::Query::transactionMetaType((Query *)&gtest_ar_.message_);
  local_131 = TVar2 == ddl;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_130,
               (AssertionResult *)"query_drop_container.transactionMetaType() == database::ddl",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(local_150);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    database::Query::databaseName_abi_cxx11_(&local_1b8,(Query *)&gtest_ar_.message_);
    local_191 = std::operator==(&local_1b8,"company");
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_190,&local_191,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_1b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_190,
                 (AssertionResult *)"query_drop_container.databaseName() == \"company\"","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xf0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1c0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      database::Query::containerName_abi_cxx11_(&local_220,(Query *)&gtest_ar_.message_);
      local_1f9 = std::operator==(&local_220,"employee");
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_220);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_250,(internal *)local_1f8,
                   (AssertionResult *)"query_drop_container.containerName() == \"employee\"","false"
                   ,"true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0xf1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        testing::Message::~Message(&local_228);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        gtest_ar__1.message_.ptr_._4_4_ = 0;
      }
    }
  }
  database::Query::~Query((Query *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(QueryTests_DropContainer,canDetermineSpecificationForDropContainer)
{
  database::Query query_drop_container = "drop container company.employee";
  ASSERT_TRUE(query_drop_container.transactionMetaType() == database::ddl);
  ASSERT_TRUE(query_drop_container.databaseName() == "company");
  ASSERT_TRUE(query_drop_container.containerName() == "employee");
}